

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_ungrouped_aggregate.cpp
# Opt level: O3

void __thiscall
duckdb::PhysicalUngroupedAggregate::SinkDistinct
          (PhysicalUngroupedAggregate *this,ExecutionContext *context,DataChunk *chunk,
          OperatorSinkInput *input)

{
  LocalSinkState *pLVar1;
  pointer puVar2;
  size_type __n;
  type pDVar3;
  type filter;
  const_reference this_00;
  pointer this_01;
  BoundAggregateExpression *pBVar4;
  mapped_type *pmVar5;
  pointer pDVar6;
  reference pvVar7;
  type this_02;
  reference this_03;
  type pGVar8;
  reference this_04;
  reference this_05;
  type this_06;
  idx_t iVar9;
  unsigned_long *idx;
  pointer __k;
  OperatorSinkInput sink_input;
  DataChunk empty_chunk;
  OperatorSinkInput local_88;
  DataChunk local_70;
  
  pLVar1 = input->local_state;
  pDVar3 = unique_ptr<duckdb::DistinctAggregateState,_std::default_delete<duckdb::DistinctAggregateState>,_true>
           ::operator*((unique_ptr<duckdb::DistinctAggregateState,_std::default_delete<duckdb::DistinctAggregateState>,_true>
                        *)((long)&input->global_state[3].super_StateWithBlockableTasks.blocked_tasks
                                  .
                                  super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>
                                  .
                                  super__Vector_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>
                                  ._M_impl.super__Vector_impl_data + 8));
  filter = unique_ptr<duckdb::DistinctAggregateCollectionInfo,_std::default_delete<duckdb::DistinctAggregateCollectionInfo>,_true>
           ::operator*(&this->distinct_collection_info);
  DataChunk::DataChunk(&local_70);
  __k = (filter->indices).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start;
  puVar2 = (filter->indices).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (__k != puVar2) {
    do {
      this_00 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                ::operator[](&this->aggregates,*__k);
      this_01 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                operator->(this_00);
      pBVar4 = BaseExpression::Cast<duckdb::BoundAggregateExpression>
                         (&this_01->super_BaseExpression);
      pmVar5 = ::std::__detail::
               _Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&filter->table_map,__k);
      __n = *pmVar5;
      pDVar6 = unique_ptr<duckdb::DistinctAggregateData,_std::default_delete<duckdb::DistinctAggregateData>,_true>
               ::operator->(&this->distinct_data);
      pvVar7 = vector<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>,_true>
               ::operator[](&pDVar6->radix_tables,__n);
      if ((pvVar7->
          super_unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>_>
          )._M_t.
          super___uniq_ptr_impl<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::RadixPartitionedHashTable_*,_std::default_delete<duckdb::RadixPartitionedHashTable>_>
          .super__Head_base<0UL,_duckdb::RadixPartitionedHashTable_*,_false>._M_head_impl !=
          (RadixPartitionedHashTable *)0x0) {
        pDVar6 = unique_ptr<duckdb::DistinctAggregateData,_std::default_delete<duckdb::DistinctAggregateData>,_true>
                 ::operator->(&this->distinct_data);
        pvVar7 = vector<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>,_true>
                 ::operator[](&pDVar6->radix_tables,__n);
        this_02 = unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>
                  ::operator*(pvVar7);
        this_03 = vector<duckdb::unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>,_true>
                  ::operator[](&pDVar3->radix_states,__n);
        pGVar8 = unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>
                 ::operator*(this_03);
        this_04 = vector<duckdb::unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>,_true>,_true>
                  ::operator[]((vector<duckdb::unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>,_true>,_true>
                                *)&pLVar1[6].partition_info.partition_data,__n);
        local_88.local_state =
             unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>,_true>::
             operator*(this_04);
        local_88.interrupt_state = input->interrupt_state;
        local_88.global_state = pGVar8;
        if ((pBVar4->filter).
            super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
            super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t
            .super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
            super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl == (Expression *)0x0) {
          RadixPartitionedHashTable::Sink
                    (this_02,context,chunk,&local_88,&local_70,&filter->indices);
        }
        else {
          this_05 = vector<duckdb::unique_ptr<duckdb::AggregateFilterData,_std::default_delete<duckdb::AggregateFilterData>,_true>,_true>
                    ::operator[]((vector<duckdb::unique_ptr<duckdb::AggregateFilterData,_std::default_delete<duckdb::AggregateFilterData>,_true>,_true>
                                  *)(pLVar1 + 6),*__k);
          this_06 = unique_ptr<duckdb::AggregateFilterData,_std::default_delete<duckdb::AggregateFilterData>,_true>
                    ::operator*(this_05);
          iVar9 = AggregateFilterData::ApplyFilter(this_06,chunk);
          (this_06->filtered_payload).count = iVar9;
          RadixPartitionedHashTable::Sink
                    (this_02,context,&this_06->filtered_payload,&local_88,&local_70,&filter->indices
                    );
        }
      }
      __k = __k + 1;
    } while (__k != puVar2);
  }
  DataChunk::~DataChunk(&local_70);
  return;
}

Assistant:

void PhysicalUngroupedAggregate::SinkDistinct(ExecutionContext &context, DataChunk &chunk,
                                              OperatorSinkInput &input) const {
	auto &sink = input.local_state.Cast<UngroupedAggregateLocalSinkState>();
	auto &global_sink = input.global_state.Cast<UngroupedAggregateGlobalSinkState>();
	D_ASSERT(distinct_data);
	auto &distinct_state = *global_sink.distinct_state;
	auto &distinct_info = *distinct_collection_info;
	auto &distinct_indices = distinct_info.Indices();

	DataChunk empty_chunk;

	auto &distinct_filter = distinct_info.Indices();

	for (auto &idx : distinct_indices) {
		auto &aggregate = aggregates[idx]->Cast<BoundAggregateExpression>();

		idx_t table_idx = distinct_info.table_map[idx];
		if (!distinct_data->radix_tables[table_idx]) {
			// This distinct aggregate shares its data with another
			continue;
		}
		D_ASSERT(distinct_data->radix_tables[table_idx]);
		auto &radix_table = *distinct_data->radix_tables[table_idx];
		auto &radix_global_sink = *distinct_state.radix_states[table_idx];
		auto &radix_local_sink = *sink.radix_states[table_idx];
		OperatorSinkInput sink_input {radix_global_sink, radix_local_sink, input.interrupt_state};

		if (aggregate.filter) {
			// The hashtable can apply a filter, but only on the payload
			// And in our case, we need to filter the groups (the distinct aggr children)

			// Apply the filter before inserting into the hashtable
			auto &filtered_data = sink.execute_state.filter_set.GetFilterData(idx);
			idx_t count = filtered_data.ApplyFilter(chunk);
			filtered_data.filtered_payload.SetCardinality(count);

			radix_table.Sink(context, filtered_data.filtered_payload, sink_input, empty_chunk, distinct_filter);
		} else {
			radix_table.Sink(context, chunk, sink_input, empty_chunk, distinct_filter);
		}
	}
}